

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSet<QWidget_*> __thiscall QDockAreaLayoutInfo::usedSeparatorWidgets(QDockAreaLayoutInfo *this)

{
  long lVar1;
  int iVar2;
  qsizetype qVar3;
  QSet<QWidget_*> *other;
  const_reference pQVar4;
  QSet<QWidget_*> *in_RSI;
  Hash in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutItem *item;
  int i_1;
  int i;
  int numSeparatorWidgets;
  QSet<QWidget_*> *result;
  qsizetype in_stack_ffffffffffffffa8;
  int local_30;
  int local_2c;
  uint3 in_stack_ffffffffffffffdc;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = (uint)in_stack_ffffffffffffffdc;
  *(undefined1 **)in_RDI.d = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QWidget_*>::QSet((QSet<QWidget_*> *)0x57672b);
  qVar3 = QList<QWidget_*>::size((QList<QWidget_*> *)(in_RSI + 1));
  iVar2 = (int)qVar3;
  QSet<QWidget_*>::reserve((QSet<QWidget_*> *)in_RDI.d,in_stack_ffffffffffffffa8);
  for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
    QList<QWidget_*>::at((QList<QWidget_*> *)in_RDI.d,in_stack_ffffffffffffffa8);
    QSet<QWidget_*>::operator<<(in_RSI,(QWidget **)in_RDI.d);
  }
  local_30 = 0;
  while( true ) {
    other = (QSet<QWidget_*> *)(long)local_30;
    qVar3 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RSI + 8));
    if (qVar3 <= (long)other) break;
    pQVar4 = QList<QDockAreaLayoutItem>::at((QList<QDockAreaLayoutItem> *)in_RDI.d,(qsizetype)other)
    ;
    if (pQVar4->subinfo != (QDockAreaLayoutInfo *)0x0) {
      usedSeparatorWidgets((QDockAreaLayoutInfo *)CONCAT44(uVar5,iVar2));
      QSet<QWidget_*>::operator+=((QSet<QWidget_*> *)in_RDI.d,other);
      QSet<QWidget_*>::~QSet((QSet<QWidget_*> *)0x576815);
    }
    local_30 = local_30 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QSet<QWidget_*>)(Hash)in_RDI.d;
}

Assistant:

QSet<QWidget*> QDockAreaLayoutInfo::usedSeparatorWidgets() const
{
    QSet<QWidget*> result;
    const int numSeparatorWidgets = separatorWidgets.size();
    result.reserve(numSeparatorWidgets);

    for (int i = 0; i < numSeparatorWidgets; ++i)
        result << separatorWidgets.at(i);

    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.subinfo != nullptr)
            result += item.subinfo->usedSeparatorWidgets();
    }

    return result;
}